

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O3

string * trim(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  long lVar2;
  string pattern;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40," \t\f\v\n\r","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  lVar2 = std::__cxx11::string::find_last_not_of
                    ((char *)__return_storage_ptr__,(ulong)local_40[0],0xffffffffffffffff);
  if (lVar2 == -1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 + 1);
  }
  lVar2 = std::__cxx11::string::find_first_not_of
                    ((char *)__return_storage_ptr__,(ulong)local_40[0],0);
  if (lVar2 == -1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string &str)
{
	const std::string pattern = " \t\f\v\n\r";
	std::string ret = str;
	std::size_t found;

	found = ret.find_last_not_of(pattern);
	if (found == std::string::npos) {
		ret.clear();
	} else {
		ret.erase(found + 1, ret.length() - found);
	}

	found = ret.find_first_not_of(pattern);
	if (found == std::string::npos) {
		ret.clear();
	} else {
		ret.erase(0, found);
	}

    return ret;
}